

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall mpt::reference<mpt::layout::graph::world>::type::type(type *this,uintptr_t initial)

{
  (this->super_world).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_00147c68;
  (this->super_world).super_object._vptr_object = (_func_int **)&PTR___cxa_pure_virtual_00148848;
  (this->super_world).super_world.color.alpha = 0xff;
  (this->super_world).super_world.color.red = '\0';
  (this->super_world).super_world.color.green = '\0';
  (this->super_world).super_world.color.blue = '\0';
  (this->super_world).super_world.attr.style = '\x01';
  (this->super_world).super_world.attr.width = '\x01';
  (this->super_world).super_world.attr.symbol = '\0';
  (this->super_world).super_world.attr.size = '\n';
  mpt_world_init(&(this->super_world).super_world,0);
  (this->super_world).super_world.cyc = 0;
  (this->super_world).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_00148368;
  (this->super_world).super_object._vptr_object = (_func_int **)&PTR_property_001483b8;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }